

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

void __thiscall
pstore::sparse_array<unsigned_long,unsigned_int>::
sparse_array<pstore::repo::details::cast_iterator<unsigned_char,pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>>>
          (sparse_array<unsigned_long,unsigned_int> *this,
          cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
          *first_index,
          cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
          *last_index)

{
  uint uVar1;
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  *puVar2;
  sparse_array<unsigned_long,unsigned_int> *psVar3;
  cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  local_38;
  cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  local_28;
  
  local_28.it_.it_.it_._M_current =
       (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
        )(first_index->it_).it_.it_._M_current;
  local_28.value_ = first_index->value_;
  local_38.it_.it_.it_._M_current =
       (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
        )(last_index->it_).it_.it_._M_current;
  local_38.value_ = last_index->value_;
  uVar1 = bitmap<pstore::repo::details::cast_iterator<unsigned_char,pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>>,void>
                    (&local_28,&local_38);
  *(uint *)this = uVar1;
  puVar2 = (first_index->it_).it_.it_._M_current;
  if (puVar2 != (last_index->it_).it_.it_._M_current) {
    (first_index->it_).it_.it_._M_current = puVar2 + 1;
  }
  puVar2 = (first_index->it_).it_.it_._M_current;
  if (puVar2 != (last_index->it_).it_.it_._M_current) {
    psVar3 = this + 0x10;
    do {
      *(undefined8 *)psVar3 = 0;
      puVar2 = puVar2 + 1;
      (first_index->it_).it_.it_._M_current = puVar2;
      psVar3 = psVar3 + 8;
    } while (puVar2 != (last_index->it_).it_.it_._M_current);
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index)
            : bitmap_{sparse_array<ValueType, BitmapType>::bitmap (first_index, last_index)} {
        // The first element will have been default-constructed by the compiler.
        if (first_index != last_index) {
            ++first_index;
        }
        auto * out = &elements_[1];
        // Default-construct the remaining objects.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }